

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

char * GetDirectoryPath(char *filePath)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  
  memset(GetDirectoryPath::dirPath,0,0x1000);
  if (((filePath[1] != ':') && (*filePath != '/')) && (*filePath != '\\')) {
    GetDirectoryPath::dirPath[0] = '.';
    GetDirectoryPath::dirPath[1] = '/';
  }
  pcVar1 = (char *)0x0;
  pcVar5 = filePath;
  do {
    __s = pcVar1;
    pcVar1 = strpbrk(pcVar5,"\\/");
    pcVar5 = pcVar1 + 1;
  } while (pcVar1 != (char *)0x0);
  if (__s != (char *)0x0) {
    if (__s == filePath) {
      GetDirectoryPath::dirPath[0] = *filePath;
      pcVar5 = GetDirectoryPath::dirPath + 1;
    }
    else {
      if ((filePath[1] == ':') || (*filePath == '\\')) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)((uint)(*filePath != '/') * 2);
      }
      sVar2 = strlen(filePath);
      sVar3 = strlen(__s);
      memcpy(GetDirectoryPath::dirPath + uVar4,filePath,(sVar2 - sVar3) + 1);
      sVar2 = strlen(filePath);
      sVar3 = strlen(__s);
      if ((filePath[1] == ':') || (*filePath == '\\')) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)((uint)(*filePath != '/') * 2);
      }
      pcVar5 = GetDirectoryPath::dirPath + (sVar2 - sVar3) + uVar4;
    }
    *pcVar5 = '\0';
  }
  return GetDirectoryPath::dirPath;
}

Assistant:

const char *GetDirectoryPath(const char *filePath)
{
/*
    // NOTE: Directory separator is different in Windows and other platforms,
    // fortunately, Windows also support the '/' separator, that's the one should be used
    #if defined(_WIN32)
        char separator = '\\';
    #else
        char separator = '/';
    #endif
*/
    const char *lastSlash = NULL;
    static char dirPath[MAX_FILEPATH_LENGTH];
    memset(dirPath, 0, MAX_FILEPATH_LENGTH);

    // In case provided path does not contain a root drive letter (C:\, D:\) nor leading path separator (\, /),
    // we add the current directory path to dirPath
    if (filePath[1] != ':' && filePath[0] != '\\' && filePath[0] != '/')
    {
        // For security, we set starting path to current directory,
        // obtained path will be concated to this
        dirPath[0] = '.';
        dirPath[1] = '/';
    }

    lastSlash = strprbrk(filePath, "\\/");
    if (lastSlash)
    {
        if (lastSlash == filePath)
        {
            // The last and only slash is the leading one: path is in a root directory
            dirPath[0] = filePath[0];
            dirPath[1] = '\0';
        }
        else
        {
            // NOTE: Be careful, strncpy() is not safe, it does not care about '\0'
            memcpy(dirPath + (filePath[1] != ':' && filePath[0] != '\\' && filePath[0] != '/' ? 2 : 0), filePath, strlen(filePath) - (strlen(lastSlash) - 1));
            dirPath[strlen(filePath) - strlen(lastSlash) + (filePath[1] != ':' && filePath[0] != '\\' && filePath[0] != '/' ? 2 : 0)] = '\0';  // Add '\0' manually
        }
    }

    return dirPath;
}